

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

bool anon_unknown.dwarf_f048e7::ParseIntegral<unsigned_char>(string_view str,uchar *out)

{
  string_view str_00;
  size_type sVar1;
  const_reference pvVar2;
  uchar *puVar3;
  uchar *in_RDX;
  size_type in_RDI;
  long in_FS_OFFSET;
  char *unaff_retaddr;
  optional<unsigned_char> opt_int;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool bVar4;
  undefined1 in_stack_ffffffffffffffd0 [16];
  size_t sVar5;
  
  sVar5 = *(size_t *)(in_FS_OFFSET + 0x28);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if (((sVar1 < 2) ||
      (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                           (size_type)in_RDX), *pvVar2 != '+')) ||
     (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                          (size_type)in_RDX), *pvVar2 != '-')) {
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    if (!bVar4) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                          (size_type)in_RDX);
      if (*pvVar2 == '+') {
        std::basic_string_view<char,_std::char_traits<char>_>::substr
                  (in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_,in_RDI);
      }
    }
    str_00._M_str = unaff_retaddr;
    str_00._M_len = sVar5;
    ToIntegral<unsigned_char>(str_00);
    bVar4 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_char> *)
                       CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    if (bVar4) {
      if (in_RDX != (uchar *)0x0) {
        puVar3 = std::optional<unsigned_char>::operator*
                           ((optional<unsigned_char> *)
                            CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        *in_RDX = *puVar3;
      }
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != sVar5) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool ParseIntegral(std::string_view str, T* out)
{
    static_assert(std::is_integral<T>::value);
    // Replicate the exact behavior of strtol/strtoll/strtoul/strtoull when
    // handling leading +/- for backwards compatibility.
    if (str.length() >= 2 && str[0] == '+' && str[1] == '-') {
        return false;
    }
    const std::optional<T> opt_int = ToIntegral<T>((!str.empty() && str[0] == '+') ? str.substr(1) : str);
    if (!opt_int) {
        return false;
    }
    if (out != nullptr) {
        *out = *opt_int;
    }
    return true;
}